

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

void Scl_LibertyReadWireLoad(Scl_Tree_t *p,Vec_Str_t *vOut)

{
  int iVar1;
  Scl_Item_t *pRoot;
  char *pcVar2;
  Scl_Item_t *pSVar3;
  int *piVar4;
  int *piVar5;
  double dVar6;
  
  iVar1 = Scl_LibertyItemNum(p,p->pItems,"wire_load");
  Vec_StrPutI_(vOut,iVar1);
  piVar4 = &p->pItems->Child;
  while (pRoot = Scl_LibertyItem(p,*piVar4), pRoot != (Scl_Item_t *)0x0) {
    iVar1 = Scl_LibertyCompare(p,pRoot->Key,"wire_load");
    if (iVar1 == 0) {
      pcVar2 = Scl_LibertyReadString(p,pRoot->Head);
      Vec_StrPutS_(vOut,pcVar2);
      piVar4 = &pRoot->Child;
      piVar5 = piVar4;
      while (pSVar3 = Scl_LibertyItem(p,*piVar5), piVar5 = piVar4, pSVar3 != (Scl_Item_t *)0x0) {
        iVar1 = Scl_LibertyCompare(p,pSVar3->Key,"capacitance");
        if (iVar1 == 0) {
          pcVar2 = Scl_LibertyReadString(p,pSVar3->Head);
          dVar6 = atof(pcVar2);
          Vec_StrPutF_(vOut,(float)dVar6);
        }
        piVar5 = &pSVar3->Next;
      }
      while (pSVar3 = Scl_LibertyItem(p,*piVar5), pSVar3 != (Scl_Item_t *)0x0) {
        iVar1 = Scl_LibertyCompare(p,pSVar3->Key,"slope");
        if (iVar1 == 0) {
          pcVar2 = Scl_LibertyReadString(p,pSVar3->Head);
          dVar6 = atof(pcVar2);
          Vec_StrPutF_(vOut,(float)dVar6);
        }
        piVar5 = &pSVar3->Next;
      }
      iVar1 = Scl_LibertyItemNum(p,pRoot,"fanout_length");
      Vec_StrPutI_(vOut,iVar1);
      while (pSVar3 = Scl_LibertyItem(p,*piVar4), pSVar3 != (Scl_Item_t *)0x0) {
        iVar1 = Scl_LibertyCompare(p,pSVar3->Key,"fanout_length");
        if (iVar1 == 0) {
          pcVar2 = Scl_LibertyReadString(p,pSVar3->Head);
          pcVar2 = strtok(pcVar2," ,");
          iVar1 = atoi(pcVar2);
          pcVar2 = strtok((char *)0x0," ");
          dVar6 = atof(pcVar2);
          Vec_StrPutI_(vOut,iVar1);
          Vec_StrPutF_(vOut,(float)dVar6);
        }
        piVar4 = &pSVar3->Next;
      }
    }
    piVar4 = &pRoot->Next;
  }
  return;
}

Assistant:

void Scl_LibertyReadWireLoad( Scl_Tree_t * p, Vec_Str_t * vOut )
{
    Scl_Item_t * pItem, * pChild;
    Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, Scl_LibertyRoot(p), "wire_load") );
    Vec_StrPut_( vOut );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "wire_load" )
    {
        Vec_StrPutS_( vOut, Scl_LibertyReadString(p, pItem->Head) );
        Scl_ItemForEachChildName( p, pItem, pChild, "capacitance" )
            Vec_StrPutF_( vOut, atof(Scl_LibertyReadString(p, pChild->Head)) );
        Scl_ItemForEachChildName( p, pItem, pChild, "slope" )
            Vec_StrPutF_( vOut, atof(Scl_LibertyReadString(p, pChild->Head)) );
        Vec_StrPut_( vOut );
        Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, pItem, "fanout_length") );
        Vec_StrPut_( vOut );
        Scl_ItemForEachChildName( p, pItem, pChild, "fanout_length" )
        {
            char * pHead  = Scl_LibertyReadString(p, pChild->Head);
            int    First  = atoi( strtok(pHead, " ,") );
            float  Second = atof( strtok(NULL, " ") );
            Vec_StrPutI_( vOut, First );
            Vec_StrPutF_( vOut, Second );
            Vec_StrPut_( vOut );
        }
        Vec_StrPut_( vOut );
    }
    Vec_StrPut_( vOut );
}